

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void __thiscall
dg::vr::RelationsAnalyzer::opGen(RelationsAnalyzer *this,ValueRelations *graph,BinaryOperator *op)

{
  char cVar1;
  char cVar2;
  BinaryOperator BVar3;
  BinaryOps opcode;
  
  cVar1 = *(char *)(*(long *)(op + -0x40) + 0x10);
  cVar2 = *(char *)(*(long *)(op + -0x20) + 0x10);
  BVar3 = op[0x10];
  opcode = (byte)BVar3 - AShr;
  solveEquality(this,graph,op);
  if (((byte)BVar3 | 4) == 0x2c) {
    solveCommutativity(this,graph,op);
    if ((opcode == Mul) || (cVar1 == '\x10' && cVar2 == '\x10')) {
      return;
    }
  }
  else if (cVar1 == '\x10' && cVar2 == '\x10') {
    return;
  }
  if (cVar1 != '\x10' && cVar2 != '\x10') {
    solveNonConstants(graph,opcode,op);
    return;
  }
  solveDifferent(this,graph,op);
  return;
}

Assistant:

void RelationsAnalyzer::opGen(ValueRelations &graph,
                              const llvm::BinaryOperator *op) {
    const auto *c1 = llvm::dyn_cast<llvm::ConstantInt>(op->getOperand(0));
    const auto *c2 = llvm::dyn_cast<llvm::ConstantInt>(op->getOperand(1));
    auto opcode = op->getOpcode();

    solveEquality(graph, op);
    if (opcode == llvm::Instruction::Add || opcode == llvm::Instruction::Mul)
        solveCommutativity(graph, op);

    if (opcode == llvm::Instruction::Mul)
        return;

    if (c1 && c2)
        return;

    if (!c1 && !c2)
        return solveNonConstants(graph, opcode, op);

    solveDifferent(graph, op);
}